

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_statement.c
# Opt level: O2

AST * parse_finish_default_statement(Translation_Data *translation_data,Scope *scope)

{
  char cVar1;
  AST_Labeled_Statement *error;
  AST *pAVar2;
  AST_Error *pAVar3;
  
  error = get_labeled_statement_tree((token *)0x0,(AST *)0x0,ST_DEFAULT);
  cVar1 = get_and_check(translation_data,KW_COLUMN);
  if (cVar1 != '\0') {
    pAVar2 = parse_statement(translation_data,scope);
    error->statement = pAVar2;
    return (AST *)error;
  }
  push_translation_error(" \':\' expected in default statement",translation_data);
  pAVar3 = get_error_tree((AST *)error);
  return (AST *)pAVar3;
}

Assistant:

struct AST* parse_finish_default_statement(struct Translation_Data* translation_data,struct Scope *scope)
{
	struct AST_Labeled_Statement *ret;
	ret=get_labeled_statement_tree(NULL,NULL,ST_DEFAULT);
	if(get_and_check(translation_data,KW_COLUMN))
	{
		ret->statement=parse_statement(translation_data,scope);
		return (struct AST*)ret;
	}else
	{
		push_translation_error(" ':' expected in default statement",translation_data);
		return (struct AST*)get_error_tree((struct AST*)ret);
	}
}